

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::Done(MeshEdgebreakerTraversalValenceEncoder *this)

{
  EncoderBuffer *target_buffer;
  uint32_t *symbols;
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  target_buffer = &(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_;
  RAnsBitEncoder::EndEncoding((RAnsBitEncoder *)this,target_buffer);
  MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams
            (&this->super_MeshEdgebreakerTraversalEncoder);
  pvVar1 = (this->context_symbols_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->context_symbols_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      EncodeVarint<unsigned_int>
                ((uint)((ulong)(*(long *)((long)&(pvVar1->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar4)
                               - *(long *)((long)pvVar1 + lVar4 + -8)) >> 2),target_buffer);
      pvVar1 = (this->context_symbols_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      symbols = *(uint32_t **)((long)pvVar1 + lVar4 + -8);
      uVar2 = *(long *)((long)&(pvVar1->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data + lVar4) - (long)symbols;
      if (uVar2 != 0) {
        EncodeSymbols(symbols,(int)(uVar2 >> 2),1,(Options *)0x0,target_buffer);
      }
      uVar3 = uVar3 + 1;
      pvVar1 = (this->context_symbols_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->context_symbols_).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
  }
  return;
}

Assistant:

void Done() {
    // Store the init face configurations and attribute seam data
    MeshEdgebreakerTraversalEncoder::EncodeStartFaces();
    MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams();

    // Store the contexts.
    for (int i = 0; i < context_symbols_.size(); ++i) {
      EncodeVarint<uint32_t>(static_cast<uint32_t>(context_symbols_[i].size()),
                             GetOutputBuffer());
      if (context_symbols_[i].size() > 0) {
        EncodeSymbols(context_symbols_[i].data(),
                      static_cast<int>(context_symbols_[i].size()), 1, nullptr,
                      GetOutputBuffer());
      }
    }
  }